

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.h
# Opt level: O0

size_t __thiscall wasm::DisjointSets::getRoot(DisjointSets *this,size_t elem)

{
  size_t sVar1;
  size_type sVar2;
  reference pvVar3;
  size_t parent;
  size_t root;
  size_t elem_local;
  DisjointSets *this_local;
  
  sVar2 = std::vector<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>::
          size(&this->info);
  parent = elem;
  if (sVar2 <= elem) {
    __assert_fail("elem < info.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/disjoint_sets.h"
                  ,0x2f,"size_t wasm::DisjointSets::getRoot(size_t)");
  }
  while (pvVar3 = std::
                  vector<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>
                  ::operator[](&this->info,parent), root = elem, pvVar3->parent != parent) {
    pvVar3 = std::
             vector<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>::
             operator[](&this->info,parent);
    parent = pvVar3->parent;
  }
  while (root != parent) {
    pvVar3 = std::
             vector<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>::
             operator[](&this->info,root);
    sVar1 = pvVar3->parent;
    pvVar3 = std::
             vector<wasm::DisjointSets::ElemInfo,_std::allocator<wasm::DisjointSets::ElemInfo>_>::
             operator[](&this->info,root);
    pvVar3->parent = parent;
    root = sVar1;
  }
  return parent;
}

Assistant:

size_t getRoot(size_t elem) {
    assert(elem < info.size());
    size_t root = elem;
    // Follow parent pointers up to the root.
    for (; info[root].parent != root; root = info[root].parent) {
    }
    // Compress the path to make subsequent getRoots of this set faster.
    while (elem != root) {
      size_t parent = info[elem].parent;
      info[elem].parent = root;
      elem = parent;
    }
    return root;
  }